

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleReadElfCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  StringEntry *pSVar2;
  ostream *poVar3;
  char local_44a [2];
  string rpath;
  cmCommandArgumentGroup group;
  cmCommandArgumentsHelper argHelper;
  cmCAString fileNameArg;
  cmCAString readArg;
  cmCAString runpathArg;
  cmCAString rpathArg;
  cmELF elf;
  cmCAString errorArg;
  
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x80) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&elf,"READ_ELF must be called with at least three additional arguments.",
               (allocator<char> *)&readArg);
    cmCommand::SetError(&this->super_cmCommand,(string *)&elf);
    std::__cxx11::string::~string((string *)&elf);
    bVar1 = false;
  }
  else {
    argHelper.Arguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    argHelper.Arguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    argHelper.Arguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    group.ContainedArguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    group.ContainedArguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    group.ContainedArguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmCAString::cmCAString(&readArg,&argHelper,"READ_ELF",(cmCommandArgumentGroup *)0x0);
    cmCAString::cmCAString(&fileNameArg,&argHelper,(char *)0x0,(cmCommandArgumentGroup *)0x0);
    cmCAString::cmCAString(&rpathArg,&argHelper,"RPATH",&group);
    cmCAString::cmCAString(&runpathArg,&argHelper,"RUNPATH",&group);
    cmCAString::cmCAString(&errorArg,&argHelper,"CAPTURE_ERROR",&group);
    cmCommandArgument::Follows(&readArg.super_cmCommandArgument,(cmCommandArgument *)0x0);
    cmCommandArgument::Follows
              (&fileNameArg.super_cmCommandArgument,&readArg.super_cmCommandArgument);
    cmCommandArgumentGroup::Follows(&group,&fileNameArg.super_cmCommandArgument);
    cmCommandArgumentsHelper::Parse
              (&argHelper,args,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0);
    bVar1 = cmsys::SystemTools::FileExists(&fileNameArg.String,true);
    if (bVar1) {
      cmELF::cmELF(&elf,fileNameArg.String._M_dataplus._M_p);
      if (rpathArg.String._M_string_length != 0) {
        pSVar2 = cmELF::GetRPath(&elf);
        if (pSVar2 != (StringEntry *)0x0) {
          std::__cxx11::string::string((string *)&rpath,(string *)pSVar2);
          local_44a[1] = 0x3a;
          local_44a[0] = ';';
          std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )rpath._M_dataplus._M_p,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(rpath._M_dataplus._M_p + rpath._M_string_length),local_44a + 1,local_44a);
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,&rpathArg.String,rpath._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&rpath);
        }
      }
      if (runpathArg.String._M_string_length != 0) {
        pSVar2 = cmELF::GetRunPath(&elf);
        if (pSVar2 != (StringEntry *)0x0) {
          std::__cxx11::string::string((string *)&rpath,(string *)pSVar2);
          local_44a[1] = 0x3a;
          local_44a[0] = ';';
          std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )rpath._M_dataplus._M_p,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(rpath._M_dataplus._M_p + rpath._M_string_length),local_44a + 1,local_44a);
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,&runpathArg.String,rpath._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&rpath);
        }
      }
      cmELF::~cmELF(&elf);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&elf);
      poVar3 = std::operator<<((ostream *)&elf,"READ_ELF given FILE \"");
      poVar3 = std::operator<<(poVar3,(string *)&fileNameArg.String);
      std::operator<<(poVar3,"\" that does not exist.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&rpath);
      std::__cxx11::string::~string((string *)&rpath);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&elf);
    }
    cmCAString::~cmCAString(&errorArg);
    cmCAString::~cmCAString(&runpathArg);
    cmCAString::~cmCAString(&rpathArg);
    cmCAString::~cmCAString(&fileNameArg);
    cmCAString::~cmCAString(&readArg);
    std::_Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>::~_Vector_base
              ((_Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_> *)&group);
    std::_Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>::~_Vector_base
              ((_Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_> *)&argHelper
              );
  }
  return bVar1;
}

Assistant:

bool cmFileCommand::HandleReadElfCommand(std::vector<std::string> const& args)
{
  if (args.size() < 4) {
    this->SetError("READ_ELF must be called with at least three additional "
                   "arguments.");
    return false;
  }

  cmCommandArgumentsHelper argHelper;
  cmCommandArgumentGroup group;

  cmCAString readArg(&argHelper, "READ_ELF");
  cmCAString fileNameArg(&argHelper, nullptr);

  cmCAString rpathArg(&argHelper, "RPATH", &group);
  cmCAString runpathArg(&argHelper, "RUNPATH", &group);
  cmCAString errorArg(&argHelper, "CAPTURE_ERROR", &group);

  readArg.Follows(nullptr);
  fileNameArg.Follows(&readArg);
  group.Follows(&fileNameArg);
  argHelper.Parse(&args, nullptr);

  if (!cmSystemTools::FileExists(fileNameArg.GetString(), true)) {
    std::ostringstream e;
    e << "READ_ELF given FILE \"" << fileNameArg.GetString()
      << "\" that does not exist.";
    this->SetError(e.str());
    return false;
  }

#if defined(CMAKE_USE_ELF_PARSER)
  cmELF elf(fileNameArg.GetCString());

  if (!rpathArg.GetString().empty()) {
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      std::string rpath(se_rpath->Value);
      std::replace(rpath.begin(), rpath.end(), ':', ';');
      this->Makefile->AddDefinition(rpathArg.GetString(), rpath.c_str());
    }
  }
  if (!runpathArg.GetString().empty()) {
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      std::string runpath(se_runpath->Value);
      std::replace(runpath.begin(), runpath.end(), ':', ';');
      this->Makefile->AddDefinition(runpathArg.GetString(), runpath.c_str());
    }
  }

  return true;
#else
  std::string error = "ELF parser not available on this platform.";
  if (errorArg.GetString().empty()) {
    this->SetError(error);
    return false;
  }
  this->Makefile->AddDefinition(errorArg.GetString(), error.c_str());
  return true;
#endif
}